

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O0

void __thiscall PlayerStrategy::~PlayerStrategy(PlayerStrategy *this)

{
  Country *pCVar1;
  string *this_00;
  Player *this_01;
  PlayerStrategy *this_local;
  
  this->_vptr_PlayerStrategy = (_func_int **)&PTR___cxa_pure_virtual_00168808;
  pCVar1 = this->from;
  if (pCVar1 != (Country *)0x0) {
    Map::Country::~Country(pCVar1);
    operator_delete(pCVar1,0x30);
  }
  pCVar1 = this->to;
  if (pCVar1 != (Country *)0x0) {
    Map::Country::~Country(pCVar1);
    operator_delete(pCVar1,0x30);
  }
  if (this->armiesToPlace != (int *)0x0) {
    operator_delete(this->armiesToPlace,4);
  }
  if (this->exchangingCardType != (int *)0x0) {
    operator_delete(this->exchangingCardType,4);
  }
  if (this->numWeakest != (int *)0x0) {
    operator_delete(this->numWeakest,4);
  }
  this_00 = this->strategyName;
  if (this_00 != (string *)0x0) {
    std::__cxx11::string::~string((string *)this_00);
    operator_delete(this_00,0x20);
  }
  this->player = (Player *)0x0;
  this_01 = this->player;
  if (this_01 != (Player *)0x0) {
    Player::~Player(this_01);
    operator_delete(this_01,0x38);
  }
  return;
}

Assistant:

PlayerStrategy::~PlayerStrategy() {
    delete from;
    delete to;
    delete armiesToPlace;
    delete exchangingCardType;
    delete numWeakest;
    delete strategyName;
    // makes sure the player is not deleted when switching strategies
    player = nullptr;
    delete player;
}